

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_analysisEnvironment_setNewSymbolLocalBinding
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t sourcePosition,
          sysbvm_tuple_t name,sysbvm_tuple_t type)

{
  _Bool _Var1;
  size_t vectorIndex;
  sysbvm_tuple_t sVar2;
  sysbvm_context_t *unaff_RBX;
  sysbvm_tuple_t unaff_RBP;
  sysbvm_tuple_t unaff_R12;
  sysbvm_tuple_t unaff_R13;
  sysbvm_tuple_t unaff_R14;
  sysbvm_tuple_t unaff_R15;
  
  sVar2 = environment;
  if (environment != 0) {
    do {
      _Var1 = sysbvm_tuple_isKindOf(context,sVar2,(context->roots).functionAnalysisEnvironmentType);
      unaff_R15 = sVar2;
      if (_Var1) goto LAB_0010ce7a;
      unaff_R15 = *(sysbvm_tuple_t *)(sVar2 + 0x30);
      unaff_RBX = context;
      unaff_RBP = sourcePosition;
      unaff_R12 = name;
      unaff_R13 = type;
      unaff_R14 = environment;
      sVar2 = unaff_R15;
    } while (unaff_R15 != 0);
  }
  environment = unaff_R14;
  type = unaff_R13;
  name = unaff_R12;
  sourcePosition = unaff_RBP;
  context = unaff_RBX;
  sysbvm_analysisEnvironment_setNewSymbolLocalBinding_cold_1();
LAB_0010ce7a:
  sVar2 = *(sysbvm_tuple_t *)(unaff_R15 + 0x88);
  vectorIndex = sysbvm_orderedCollection_getSize(*(sysbvm_tuple_t *)(unaff_R15 + 0xa8));
  sVar2 = sysbvm_symbolLocalBinding_create(context,sourcePosition,name,type,sVar2,vectorIndex);
  if (name != 0) {
    sysbvm_environment_setNewBinding(context,environment,sVar2);
  }
  sysbvm_orderedCollection_add(context,*(sysbvm_tuple_t *)(unaff_R15 + 0xa8),sVar2);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_analysisEnvironment_setNewSymbolLocalBinding(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t name, sysbvm_tuple_t type)
{
    sysbvm_tuple_t functionAnalysisEnvironment = sysbvm_environment_lookFunctionAnalysisEnvironmentRecursively(context, environment);
    if(!functionAnalysisEnvironment)
        sysbvm_error("A function analysis environment is required here.");

    sysbvm_functionAnalysisEnvironment_t *functionAnalysisEnvironmentObject = (sysbvm_functionAnalysisEnvironment_t*)functionAnalysisEnvironment;
    sysbvm_tuple_t binding = sysbvm_symbolLocalBinding_create(context, sourcePosition, name, type, functionAnalysisEnvironmentObject->functionDefinition, sysbvm_orderedCollection_getSize(functionAnalysisEnvironmentObject->localBindingList));
    if(name)
        sysbvm_environment_setNewBinding(context, environment, binding);
    sysbvm_orderedCollection_add(context, functionAnalysisEnvironmentObject->localBindingList, binding);
    return binding;
}